

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgpaintelement.cpp
# Opt level: O2

bool __thiscall
lunasvg::SVGPatternElement::applyPaint(SVGPatternElement *this,SVGRenderState *state,float opacity)

{
  bool bVar1;
  float tx;
  float ty;
  float fVar2;
  float fVar3;
  float extraout_XMM0_Da;
  float sx;
  float sy;
  float extraout_XMM0_Db;
  float in_XMM1_Da;
  float sx_00;
  float in_XMM1_Db;
  float sy_00;
  shared_ptr<lunasvg::Canvas> patternImage;
  Transform patternImageTransform;
  Transform patternTransform;
  SVGPatternAttributes attributes;
  __shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2> local_a8;
  SVGRenderState local_90;
  LengthContext lengthContext;
  Transform currentTransform;
  
  bVar1 = SVGRenderState::hasCycleReference(state,(SVGElement *)this);
  if (bVar1) {
    return false;
  }
  collectPatternAttributes(&attributes,this);
  bVar1 = attributes.m_patternContentElement != (SVGPatternElement *)0x0;
  if (attributes.m_patternContentElement == (SVGPatternElement *)0x0) {
    return bVar1;
  }
  lengthContext.m_units = ((attributes.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9;
  lengthContext.m_element = (SVGElement *)this;
  tx = LengthContext::valueForLength(&lengthContext,&(attributes.m_x)->m_x);
  ty = LengthContext::valueForLength(&lengthContext,&(attributes.m_y)->m_y);
  fVar2 = LengthContext::valueForLength(&lengthContext,&(attributes.m_width)->m_width);
  fVar3 = LengthContext::valueForLength(&lengthContext,&(attributes.m_height)->m_height);
  if (((attributes.m_patternUnits)->m_patternUnits).super_SVGProperty.field_0x9 == '\x01') {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    tx = tx * in_XMM1_Da + extraout_XMM0_Da;
    ty = ty * in_XMM1_Db + extraout_XMM0_Db;
    fVar2 = fVar2 * in_XMM1_Da;
    fVar3 = fVar3 * in_XMM1_Db;
  }
  Transform::operator*
            (&currentTransform,
             (Transform *)
             &((attributes.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc,
             &state->m_currentTransform);
  sx = Transform::xScale(&currentTransform);
  sy = Transform::yScale(&currentTransform);
  Canvas::create((Canvas *)&patternImage,0.0,0.0,fVar2 * sx,fVar3 * sy);
  sy_00 = 0.0;
  sx_00 = sy;
  Transform::scaled(&patternImageTransform,sx,sy);
  if (0.0 <= *(float *)&((attributes.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x14) {
    sx_00 = 0.0;
    sy_00 = 0.0;
    if (0.0 <= *(float *)&((attributes.m_viewBox)->super_SVGFitToViewBox).m_viewBox.field_0x18) {
      patternTransform.m_matrix.b = fVar3;
      patternTransform.m_matrix.a = fVar2;
      SVGPreserveAspectRatio::getTransform
                ((Transform *)&local_90,
                 &((attributes.m_preserveAspectRatio)->super_SVGFitToViewBox).m_preserveAspectRatio,
                 (Rect *)&((attributes.m_viewBox)->super_SVGFitToViewBox).m_viewBox.
                          super_SVGProperty.field_0xc,(Size *)&patternTransform);
      Transform::multiply(&patternImageTransform,(Transform *)&local_90);
      goto LAB_00116cb5;
    }
  }
  if (((attributes.m_patternContentUnits)->m_patternContentUnits).super_SVGProperty.field_0x9 ==
      '\x01') {
    (*(state->m_element->super_SVGNode)._vptr_SVGNode[0xb])();
    Transform::scale(&patternImageTransform,sx_00,sy_00);
  }
LAB_00116cb5:
  std::__shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_a8,&patternImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>
            );
  local_90.m_currentTransform.m_matrix.a = patternImageTransform.m_matrix.a;
  local_90.m_currentTransform.m_matrix.b = patternImageTransform.m_matrix.b;
  local_90.m_currentTransform.m_matrix.c = patternImageTransform.m_matrix.c;
  local_90.m_currentTransform.m_matrix.d = patternImageTransform.m_matrix.d;
  local_90.m_currentTransform.m_matrix.e = patternImageTransform.m_matrix.e;
  local_90.m_currentTransform.m_matrix.f = patternImageTransform.m_matrix.f;
  local_90.m_mode = Painting;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_a8._M_ptr;
  local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_a8._M_refcount._M_pi;
  local_a8._M_ptr = (element_type *)0x0;
  local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90.m_element = (SVGElement *)this;
  local_90.m_parent = state;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  SVGElement::renderChildren((SVGElement *)attributes.m_patternContentElement,&local_90);
  patternTransform.m_matrix._0_8_ =
       *(undefined8 *)
        &((attributes.m_patternTransform)->m_patternTransform).super_SVGProperty.field_0xc;
  patternTransform.m_matrix.c =
       *(float *)&((attributes.m_patternTransform)->m_patternTransform).field_0x14;
  patternTransform.m_matrix.d =
       *(float *)&((attributes.m_patternTransform)->m_patternTransform).field_0x18;
  patternTransform.m_matrix.e =
       *(float *)&((attributes.m_patternTransform)->m_patternTransform).field_0x1c;
  patternTransform.m_matrix.f =
       *(float *)&((attributes.m_patternTransform)->m_patternTransform).field_0x20;
  Transform::translate(&patternTransform,tx,ty);
  Transform::scale(&patternTransform,1.0 / sx,1.0 / sy);
  Canvas::setTexture((state->m_canvas).
                     super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     patternImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,Tiled,opacity,&patternTransform);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_90.m_canvas.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&patternImage.super___shared_ptr<lunasvg::Canvas,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return bVar1;
}

Assistant:

bool SVGPatternElement::applyPaint(SVGRenderState& state, float opacity) const
{
    if(state.hasCycleReference(this))
        return false;
    auto attributes = collectPatternAttributes();
    auto patternContentElement = attributes.patternContentElement();
    if(patternContentElement == nullptr)
        return false;
    LengthContext lengthContext(this, attributes.patternUnits());
    Rect patternRect = {
        lengthContext.valueForLength(attributes.x()),
        lengthContext.valueForLength(attributes.y()),
        lengthContext.valueForLength(attributes.width()),
        lengthContext.valueForLength(attributes.height())
    };

    if(attributes.patternUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternRect.x = patternRect.x * bbox.w + bbox.x;
        patternRect.y = patternRect.y * bbox.h + bbox.y;
        patternRect.w = patternRect.w * bbox.w;
        patternRect.h = patternRect.h * bbox.h;
    }

    auto currentTransform = attributes.patternTransform() * state.currentTransform();
    auto xScale = currentTransform.xScale();
    auto yScale = currentTransform.yScale();

    auto patternImage = Canvas::create(0, 0, patternRect.w * xScale, patternRect.h * yScale);
    auto patternImageTransform = Transform::scaled(xScale, yScale);

    const auto& viewBoxRect = attributes.viewBox();
    if(viewBoxRect.isValid()) {
        const auto& preserveAspectRatio = attributes.preserveAspectRatio();
        patternImageTransform.multiply(preserveAspectRatio.getTransform(viewBoxRect, patternRect.size()));
    } else if(attributes.patternContentUnits() == Units::ObjectBoundingBox) {
        auto bbox = state.fillBoundingBox();
        patternImageTransform.scale(bbox.w, bbox.h);
    }

    SVGRenderState newState(this, &state, patternImageTransform, SVGRenderMode::Painting, patternImage);
    patternContentElement->renderChildren(newState);

    auto patternTransform = attributes.patternTransform();
    patternTransform.translate(patternRect.x, patternRect.y);
    patternTransform.scale(1.f / xScale, 1.f / yScale);
    state->setTexture(*patternImage, TextureType::Tiled, opacity, patternTransform);
    return true;
}